

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

bool __thiscall tchecker::clockbounds::df_solver_t::solve(df_solver_t *this,local_lu_map_t *map)

{
  clock_id_t cVar1;
  loc_id_t lVar2;
  bool bVar3;
  clock_id_t cVar4;
  loc_id_t lVar5;
  bound_t bVar6;
  map_t *pmVar7;
  int *piVar8;
  invalid_argument *this_00;
  clock_id_t clock;
  uint x;
  loc_id_t loc;
  uint l;
  
  cVar1 = this->_clock_number;
  cVar4 = local_lu_map_t::clock_number(map);
  if (cVar1 == cVar4) {
    lVar2 = this->_loc_number;
    lVar5 = local_lu_map_t::loc_number(map);
    if (lVar2 == lVar5) {
      bVar3 = ensure_tight(this);
      if (bVar3) {
        for (l = 0; l < this->_loc_number; l = l + 1) {
          for (x = 0; x < this->_clock_number; x = x + 1) {
            bVar6 = L(this,l,x);
            pmVar7 = local_lu_map_t::L(map,l);
            piVar8 = make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>::operator[]
                               (pmVar7,x);
            *piVar8 = bVar6;
            bVar6 = U(this,l,x);
            pmVar7 = local_lu_map_t::U(map,l);
            piVar8 = make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>::operator[]
                               (pmVar7,x);
            *piVar8 = bVar6;
          }
        }
      }
      return bVar3;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"*** solve: invalid number of locations");
  }
  else {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"*** solve: invalid number of clocks");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool df_solver_t::solve(tchecker::clockbounds::local_lu_map_t & map)
{
  if (_clock_number != map.clock_number())
    throw std::invalid_argument("*** solve: invalid number of clocks");
  if (_loc_number != map.loc_number())
    throw std::invalid_argument("*** solve: invalid number of locations");

  bool consistent = ensure_tight();
  if (!consistent)
    return false;

  for (tchecker::loc_id_t loc = 0; loc < _loc_number; ++loc)
    for (tchecker::clock_id_t clock = 0; clock < _clock_number; ++clock) {
      map.L(loc)[clock] = L(loc, clock);
      map.U(loc)[clock] = U(loc, clock);
    }

  return true;
}